

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void ma_preinitialize(char *caller)

{
  long lVar1;
  char *in_stack_00000008;
  ErrorType in_stack_00000010;
  ErrorLevel in_stack_00000014;
  
  if (ma_preinitialized == 0) {
    lVar1 = ma_set_sizes_();
    if (lVar1 == 0) {
      sprintf(ma_ebuf,"unable to set sizes of FORTRAN datatypes");
      ma_error(in_stack_00000014,in_stack_00000010,in_stack_00000008,caller);
    }
    else {
      ma_preinitialized = 1;
    }
  }
  return;
}

Assistant:

private void ma_preinitialize(caller)
    char    *caller;    /* name of calling routine */
{
    if (ma_preinitialized)
        return;

    /* call a FORTRAN routine to set bases and sizes of FORTRAN datatypes */
    if (ma_set_sizes_() == 0)
    {
        (void)sprintf(ma_ebuf,
            "unable to set sizes of FORTRAN datatypes");
        ma_error(EL_Fatal, ET_Internal, caller, ma_ebuf);
        return;
    }

    /* success */
    ma_preinitialized = MA_TRUE;
}